

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void lj_err_argtype(lua_State *L,int narg,char *xname)

{
  ulong uVar1;
  TValue *pTVar2;
  char **ppcVar3;
  char *msg;
  
  if (narg < -9999) {
    if (-0x2713 < narg) {
      ppcVar3 = lj_obj_itypename + 0xb;
      goto LAB_0010b7ec;
    }
    uVar1 = L->base[-2].u64 & 0x7fffffffffff;
    if ((int)(uint)*(byte *)(uVar1 + 0xb) < -0x2712 - narg) goto LAB_0010b7e5;
    pTVar2 = (TValue *)(uVar1 + (ulong)(-narg - 0x2713) * 8 + 0x30);
  }
  else {
    if (narg < 0) {
      pTVar2 = L->top + narg;
    }
    else {
      pTVar2 = L->base + ((ulong)(uint)narg - 1);
    }
    if (L->top <= pTVar2) {
LAB_0010b7e5:
      ppcVar3 = lj_obj_typename;
      goto LAB_0010b7ec;
    }
  }
  uVar1 = 0xd;
  if (0xfffffffffffffff2 < (ulong)(pTVar2->it64 >> 0x2f)) {
    uVar1 = ~(pTVar2->it64 >> 0x2f);
  }
  ppcVar3 = lj_obj_itypename + uVar1;
LAB_0010b7ec:
  msg = lj_strfmt_pushf(L,lj_err_allmsg + 0x205,xname,*ppcVar3);
  err_argmsg(L,narg,msg);
}

Assistant:

LJ_NOINLINE void lj_err_argtype(lua_State *L, int narg, const char *xname)
{
  const char *tname, *msg;
  if (narg <= LUA_REGISTRYINDEX) {
    if (narg >= LUA_GLOBALSINDEX) {
      tname = lj_obj_itypename[~LJ_TTAB];
    } else {
      GCfunc *fn = curr_func(L);
      int idx = LUA_GLOBALSINDEX - narg;
      if (idx <= fn->c.nupvalues)
	tname = lj_typename(&fn->c.upvalue[idx-1]);
      else
	tname = lj_obj_typename[0];
    }
  } else {
    TValue *o = narg < 0 ? L->top + narg : L->base + narg-1;
    tname = o < L->top ? lj_typename(o) : lj_obj_typename[0];
  }
  msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADTYPE), xname, tname);
  err_argmsg(L, narg, msg);
}